

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

int on_message_complete(http_parser *parser)

{
  code *pcVar1;
  int iVar2;
  cio_error cVar3;
  char *msg;
  
  if (-1 < *(int *)&parser->field_0x14) {
    cVar3 = cio_timer_cancel((cio_timer *)&parser[-7].data);
    if (cVar3 != CIO_SUCCESS) {
      msg = "Cancelling read timer in on_message_complete failed, maybe not armed?";
      goto LAB_0010387b;
    }
    *(code **)&parser[-2].http_major = restart_read_request;
  }
  iVar2 = 0;
  if (((char)parser[-2].content_length == '\0') &&
     (pcVar1 = *(code **)((long)parser[-0x14].data + 0x58), pcVar1 != (code *)0x0)) {
    iVar2 = (*pcVar1)(&parser[-0x1b].content_length);
  }
  if (*(char *)((long)&parser[-2].content_length + 2) != '\0') {
    *(undefined1 *)((long)&parser[-2].content_length + 1) = 1;
    return iVar2;
  }
  msg = "After receiving the complete message, no response was written!";
LAB_0010387b:
  handle_server_error((cio_http_client *)&parser[-0x1b].content_length,msg);
  return 0;
}

Assistant:

static int on_message_complete(http_parser *parser)
{
	struct cio_http_client *client = cio_container_of(parser, struct cio_http_client, parser);

	if (cio_unlikely(!client->parser.upgrade)) {
		enum cio_error err = cio_timer_cancel(&client->http_private.request_timer);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_server_error(client, "Cancelling read timer in on_message_complete failed, maybe not armed?");
			return 0;
		}

		client->http_private.finish_func = restart_read_request;
	}

	enum cio_http_cb_return ret = CIO_HTTP_CB_SUCCESS;
	if ((!client->http_private.response_fired) && client->current_handler->on_message_complete) {
		ret = client->current_handler->on_message_complete(client);
	}

	if (cio_unlikely(!client->http_private.response_written)) {
		handle_server_error(client, "After receiving the complete message, no response was written!");
		return CIO_HTTP_CB_SUCCESS;
	}

	client->http_private.request_complete = true;
	return ret;
}